

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mem.cc
# Opt level: O2

int CRYPTO_memcmp(void *a,void *b,size_t len)

{
  byte bVar1;
  size_t i;
  size_t sVar2;
  
  bVar1 = 0;
  for (sVar2 = 0; len != sVar2; sVar2 = sVar2 + 1) {
    bVar1 = bVar1 | *(byte *)((long)b + sVar2) ^ *(byte *)((long)a + sVar2);
  }
  return (int)bVar1;
}

Assistant:

int CRYPTO_memcmp(const void *in_a, const void *in_b, size_t len) {
  const uint8_t *a = reinterpret_cast<const uint8_t *>(in_a);
  const uint8_t *b = reinterpret_cast<const uint8_t *>(in_b);
  uint8_t x = 0;

  for (size_t i = 0; i < len; i++) {
    x |= a[i] ^ b[i];
  }

  return x;
}